

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O1

int helics::apps::addUsedPotentialInterfaceTemplates
              (json *potentialCommand,
              vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
              *potentials,string *possibleFed,int logLevel,string *type,Federate *fed)

{
  TemplateMatcher *this;
  value_t vVar1;
  pointer pTVar2;
  size_t sVar3;
  size_t __n;
  pointer ptVar4;
  json_value jVar5;
  pointer pcVar6;
  pointer pcVar7;
  string *psVar8;
  Federate *this_00;
  int iVar9;
  uint uVar10;
  pointer in_RAX;
  reference pvVar11;
  pointer extraout_RAX;
  pointer extraout_RAX_00;
  bool bVar12;
  bool bVar13;
  pointer pTVar14;
  pointer pcVar15;
  bool bVar16;
  string_view fmt;
  string_view message;
  format_args args;
  data local_128;
  string *local_118;
  json *local_110;
  string local_108;
  undefined1 local_e8 [32];
  Federate *local_c8;
  pointer local_c0;
  undefined1 local_b8 [32];
  key_type local_98;
  undefined1 local_78 [32];
  pointer local_58;
  char *pcStack_50;
  pointer local_48;
  pointer puStack_40;
  
  pTVar14 = (potentials->
            super__Vector_base<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pTVar2 = (potentials->
           super__Vector_base<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pTVar14 != pTVar2) {
    pcVar15 = (possibleFed->_M_dataplus)._M_p;
    sVar3 = possibleFed->_M_string_length;
    bVar12 = false;
    bVar13 = false;
    pTVar14 = pTVar14 + 1;
    local_118 = type;
    local_110 = potentialCommand;
    local_c8 = fed;
    local_c0 = (pointer)potentials;
    do {
      __n = pTVar14[-1].federate._M_len;
      if (__n == sVar3) {
        if (__n != 0) {
          iVar9 = bcmp(pTVar14[-1].federate._M_str,pcVar15,__n);
          if (iVar9 != 0) goto LAB_002a2479;
        }
        ptVar4 = pTVar14[-1].usedTemplates.
                 super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar16 = ptVar4 != pTVar14[-1].usedTemplates.
                           super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
        in_RAX = (pointer)CONCAT71((int7)((ulong)ptVar4 >> 8),bVar16);
        bVar13 = bVar12;
        if (bVar16) {
          bVar12 = true;
          bVar13 = true;
        }
      }
      else {
LAB_002a2479:
        in_RAX = (pointer)0x0;
      }
      this_00 = local_c8;
      psVar8 = local_118;
    } while (((char)in_RAX == '\0') &&
            (in_RAX = pTVar14 + 1, bVar16 = pTVar14 != pTVar2, pTVar14 = in_RAX, bVar16));
    if (bVar13) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_128,(initializer_list_t)ZEXT816(0),false,array);
      pcVar15 = (psVar8->_M_dataplus)._M_p;
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,pcVar15,pcVar15 + psVar8->_M_string_length);
      pvVar11 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::operator[](local_110,&local_98);
      vVar1 = (pvVar11->m_data).m_type;
      (pvVar11->m_data).m_type = local_128.m_type;
      jVar5 = (pvVar11->m_data).m_value;
      (pvVar11->m_data).m_value = local_128.m_value;
      local_128.m_type = vVar1;
      local_128.m_value = jVar5;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_128);
      psVar8 = local_118;
      pcVar15 = (local_c0->templateName)._M_dataplus._M_p;
      pcVar6 = (pointer)(local_c0->templateName)._M_string_length;
      in_RAX = local_c0;
      if (pcVar15 != pcVar6) {
        this = (TemplateMatcher *)(local_78 + 0x10);
        do {
          sVar3 = *(size_t *)(pcVar15 + 0x20);
          in_RAX = (pointer)possibleFed;
          if (sVar3 == possibleFed->_M_string_length) {
            if (sVar3 != 0) {
              uVar10 = bcmp(*(void **)(pcVar15 + 0x28),(possibleFed->_M_dataplus)._M_p,sVar3);
              in_RAX = (pointer)(ulong)uVar10;
              if (uVar10 != 0) goto LAB_002a26f0;
            }
            in_RAX = *(pointer *)(pcVar15 + 0x48);
            if (in_RAX != *(pointer *)(pcVar15 + 0x50)) {
              local_e8._0_8_ = local_e8 + 0x10;
              pcVar7 = (psVar8->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_e8,pcVar7,pcVar7 + psVar8->_M_string_length);
              pvVar11 = nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::operator[](local_110,(key_type *)local_e8);
              TemplateMatcher::usedInterfaceGeneration_abi_cxx11_(this);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::push_back(pvVar11,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                   *)this);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::data::~data((data *)this);
              in_RAX = (pointer)(local_e8 + 0x10);
              if ((pointer)local_e8._0_8_ != in_RAX) {
                operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
                in_RAX = extraout_RAX;
              }
              if (8 < logLevel) {
                TemplateMatcher::usedInterfaceGeneration_abi_cxx11_((TemplateMatcher *)local_78);
                fileops::generateJsonString((string *)local_b8,(json *)local_78,true);
                local_78._16_8_ = (possibleFed->_M_dataplus)._M_p;
                local_78._24_8_ = possibleFed->_M_string_length;
                local_58 = (psVar8->_M_dataplus)._M_p;
                pcStack_50 = (char *)psVar8->_M_string_length;
                local_48 = (pointer)local_b8._0_8_;
                puStack_40 = (pointer)local_b8._8_8_;
                fmt.size_ = 0xddd;
                fmt.data_ = (char *)0x19;
                args.field_1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                               (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                               fed;
                args.desc_ = (unsigned_long_long)this;
                ::fmt::v11::vformat_abi_cxx11_
                          (&local_108,(v11 *)"federate {} request {} {}",fmt,args);
                message._M_str = local_108._M_dataplus._M_p;
                message._M_len = local_108._M_string_length;
                Federate::logMessage(this_00,9,message);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108._M_dataplus._M_p != &local_108.field_2) {
                  operator_delete(local_108._M_dataplus._M_p,
                                  local_108.field_2._M_allocated_capacity + 1);
                }
                if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
                  operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
                }
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::data::~data((data *)local_78);
                in_RAX = extraout_RAX_00;
              }
            }
          }
LAB_002a26f0:
          pcVar15 = pcVar15 + 0xa8;
        } while (pcVar15 != pcVar6);
      }
    }
  }
  return (int)in_RAX;
}

Assistant:

static int addUsedPotentialInterfaceTemplates(nlohmann::json& potentialCommand,
                                              std::vector<TemplateMatcher>& potentials,
                                              const std::string& possibleFed,
                                              int logLevel,
                                              const std::string& type,
                                              Federate* fed)
{
    bool hasInterfaceTemplates{false};
    for (auto& ifaceTemplate : potentials) {
        if (ifaceTemplate.federate != possibleFed) {
            continue;
        }
        if (!ifaceTemplate.isUsed()) {
            continue;
        }
        hasInterfaceTemplates = true;
        break;
    }
    if (hasInterfaceTemplates) {
        potentialCommand[type] = nlohmann::json::array();
        for (auto& ifaceTemplate : potentials) {
            if (ifaceTemplate.federate != possibleFed) {
                continue;
            }
            if (!ifaceTemplate.isUsed()) {
                continue;
            }
            potentialCommand[type].push_back(ifaceTemplate.usedInterfaceGeneration());
            if (logLevel >= HELICS_LOG_LEVEL_CONNECTIONS) {
                fed->logMessage(HELICS_LOG_LEVEL_CONNECTIONS,
                                fmt::format("federate {} request {} {}",
                                            possibleFed,
                                            type,
                                            fileops::generateJsonString(
                                                ifaceTemplate.usedInterfaceGeneration())));
            }
        }
    }
    return 0;
}